

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O1

void x86_64_branch(dill_stream s,int op,int type,int src1,int src2,int label)

{
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  private_ctx pdVar4;
  uint rex;
  uint uVar5;
  uchar *puVar6;
  
  uVar5 = (uint)(type - 6U < 3) * 8;
  if (((uint)type < 8) && ((0xaaU >> (type & 0x1fU) & 1) != 0)) {
    op = op + 6;
  }
  rex = uVar5 + 4 + (uint)(7 < src1);
  if (src2 < 8) {
    rex = uVar5 | 7 < src1;
  }
  uVar5 = (src1 & 7U) + (src2 & 0x1fU) * 8 | 0xc0;
  if (type == 9) {
    BYTE_OUT3R(s,rex,0xf,0x2e,uVar5);
  }
  else if (type == 10) {
    BYTE_OUT1R3(s,0x66,rex,0x2e,uVar5,label);
  }
  else {
    BYTE_OUT2R(s,rex,0x39,uVar5);
  }
  dill_mark_branch_location(s,label);
  pcVar2 = s->p->cur_ip;
  pcVar3 = s->p->code_limit;
  if (type - 9U < 2) {
    if (pcVar3 <= pcVar2) {
      extend_dill_stream(s);
    }
    *s->p->cur_ip = '\x0f';
    puVar6 = fop_conds;
  }
  else {
    if (pcVar3 <= pcVar2) {
      extend_dill_stream(s);
    }
    *s->p->cur_ip = '\x0f';
    puVar6 = op_conds;
  }
  s->p->cur_ip[1] = puVar6[op];
  pcVar2 = s->p->cur_ip;
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  pdVar4 = s->p;
  pcVar2 = pdVar4->cur_ip;
  pdVar4->cur_ip = pcVar2 + 6;
  if (pdVar4->code_limit <= pcVar2 + 6) {
    extend_dill_stream(s);
  }
  *s->p->cur_ip = -0x70;
  if (s->dill_debug != 0) {
    dump_cur_dill_insn(s);
  }
  ppcVar1 = &s->p->cur_ip;
  *ppcVar1 = *ppcVar1 + 1;
  return;
}

Assistant:

extern void
x86_64_branch(dill_stream s, int op, int type, int src1, int src2, int label)
{
    int rex = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P))
        rex |= REX_W;

    switch (type) {
    case DILL_U:
    case DILL_UL:
    case DILL_US:
    case DILL_UC:
        op += 6; /* second set of codes */
                 /* fall through */
    default:
        if (src1 > RDI)
            rex |= REX_B;
        if (src2 > RDI)
            rex |= REX_R;
        if (type == DILL_D) {
            BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x2e, ModRM(0x3, src2, src1));
        } else if (type == DILL_F) {
            BYTE_OUT3R(s, rex, 0x0f, 0x2e, ModRM(0x3, src2, src1));
        } else {
            BYTE_OUT2R(s, rex, 0x39, ModRM(0x3, src2, src1));
        }
        dill_mark_branch_location(s, label);
        if ((type == DILL_D) || (type == DILL_F)) {
            BYTE_OUT2I(s, 0x0f, fop_conds[op], 0);
        } else {
            BYTE_OUT2I(s, 0x0f, op_conds[op], 0);
        }
    }
    x86_64_nop(s);
}